

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_kv_functional_test.cc
# Opt level: O0

void multi_kv_open_test(void)

{
  fdb_status fVar1;
  fdb_file_handle *in_stack_fffffffffffffcf8;
  void *local_2c8;
  void *thread_ret;
  char local_2b8 [4];
  int i_2;
  char kvname [8];
  fdb_kvs_handle *db;
  int i_1;
  int i;
  undefined1 local_288 [252];
  int local_18c;
  int r;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  fdb_status status;
  fdb_file_handle *dbfile;
  pthread_t *tid;
  int nthreads;
  int n;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  memleak_start();
  local_18c = system("rm -rf  multi_kv_test* > errorlog.txt");
  fdb_get_default_config();
  memcpy(&kvs_config.custom_cmp_param,local_288,0xf8);
  fdb_get_default_kvs_config();
  fVar1 = fdb_open((fdb_file_handle **)fconfig.encryption_key._0_8_,
                   (char *)fconfig.num_bgflusher_threads,(fdb_config *)fconfig._128_8_);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
            ,0x94d);
    multi_kv_open_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                    ,0x94d,"void multi_kv_open_test()");
    }
  }
  for (db._4_4_ = 0; db._4_4_ < 7; db._4_4_ = db._4_4_ + 1) {
    pthread_create((pthread_t *)(&stack0xfffffffffffffcf8 + (long)db._4_4_ * 8),
                   (pthread_attr_t *)0x0,_opening_thread,(void *)0x0);
  }
  db._0_4_ = 0;
  do {
    if (0xff < (int)(uint)db) {
      for (thread_ret._4_4_ = 0; thread_ret._4_4_ < 7; thread_ret._4_4_ = thread_ret._4_4_ + 1) {
        pthread_join(*(pthread_t *)(&stack0xfffffffffffffcf8 + (long)thread_ret._4_4_ * 8),
                     &local_2c8);
      }
      fVar1 = fdb_close(in_stack_fffffffffffffcf8);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                ,0x960);
        multi_kv_open_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                        ,0x960,"void multi_kv_open_test()");
        }
      }
      fVar1 = fdb_shutdown();
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                ,0x962);
        multi_kv_open_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                        ,0x962,"void multi_kv_open_test()");
        }
      }
      memleak_end();
      if (multi_kv_open_test::__test_pass == 0) {
        fprintf(_stderr,"%s FAILED\n","multi KV creation with parallel open");
      }
      else {
        fprintf(_stderr,"%s PASSED\n","multi KV creation with parallel open");
      }
      return;
    }
    sprintf(local_2b8,"kv_%d",(ulong)(uint)db);
    fVar1 = fdb_kvs_open((fdb_file_handle *)fconfig._32_8_,(fdb_kvs_handle **)fconfig._24_8_,
                         (char *)fconfig.wal_threshold,(fdb_kvs_config *)fconfig.buffercache_size);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
              ,0x957);
      multi_kv_open_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                      ,0x957,"void multi_kv_open_test()");
      }
    }
    db._0_4_ = (uint)db + 1;
  } while( true );
}

Assistant:

void multi_kv_open_test()
{
    TEST_INIT();
    memleak_start();

    int n = 256;
    int nthreads = 7;
    thread_t *tid = alca(thread_t, nthreads);
    fdb_file_handle *dbfile;
    fdb_status status;
    fdb_config fconfig;
    fdb_kvs_config kvs_config;

    // remove previous multi_kv_test files
    int r = system(SHELL_DEL" multi_kv_test* > errorlog.txt");
    (void)r;

    fconfig = fdb_get_default_config();
    kvs_config = fdb_get_default_kvs_config();

    // open db
    status = fdb_open(&dbfile, "multi_kv_test2", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    for (int i = 0; i < nthreads; ++i) {
        thread_create(&tid[i], _opening_thread, NULL);
    }
    for (int i = 0; i < n; ++i) {
        fdb_kvs_handle *db;
        char kvname[8];
        sprintf(kvname, "kv_%d", i);
        status = fdb_kvs_open(dbfile, &db, kvname, &kvs_config);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    for (int i = 0; i < nthreads; ++i) {
        void *thread_ret;
        thread_join(tid[i], &thread_ret);
    }

    status = fdb_close(dbfile);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_shutdown();
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    memleak_end();
    TEST_RESULT("multi KV creation with parallel open");
}